

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

string * duckdb::CastExceptionText<duckdb::interval_t,duckdb::interval_t>(interval_t input)

{
  bool bVar1;
  undefined8 in_RDX;
  int64_t in_RSI;
  string *in_RDI;
  interval_t iVar2;
  interval_t iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  string local_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  string local_1d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  int64_t local_f8;
  undefined8 uStack_f0;
  string local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  int64_t local_18;
  undefined8 uStack_10;
  
  local_18 = in_RSI;
  uStack_10 = in_RDX;
  bVar1 = TypeIsNumber<duckdb::interval_t>();
  if ((bVar1) && (bVar1 = TypeIsNumber<duckdb::interval_t>(), bVar1)) {
    GetTypeId<duckdb::interval_t>();
    duckdb::TypeIdToString_abi_cxx11_((PhysicalType)local_b8);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                   in_stack_fffffffffffffdd0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                   (char *)in_stack_fffffffffffffdd0);
    local_f8 = local_18;
    uStack_f0 = uStack_10;
    iVar2.micros = local_18;
    iVar2._0_8_ = local_e8;
    duckdb::ConvertToString::Operation<duckdb::interval_t>(iVar2);
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                   (char *)in_stack_fffffffffffffdd0);
    GetTypeId<duckdb::interval_t>();
    duckdb::TypeIdToString_abi_cxx11_((PhysicalType)local_118);
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
  }
  else {
    GetTypeId<duckdb::interval_t>();
    __rhs = &local_1b8;
    duckdb::TypeIdToString_abi_cxx11_((PhysicalType)__rhs);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),(char *)__rhs);
    iVar3.micros = local_18;
    iVar3._0_8_ = local_1d8;
    duckdb::ConvertToString::Operation<duckdb::interval_t>(iVar3);
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),(char *)__rhs);
    GetTypeId<duckdb::interval_t>();
    duckdb::TypeIdToString_abi_cxx11_((PhysicalType)local_208);
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  return in_RDI;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}